

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

void __thiscall IR::LabelInstr::AddLabelRef(LabelInstr *this,BranchInstr *branchRef)

{
  BranchInstr *local_10;
  BranchInstr *branchRef_local;
  
  local_10 = branchRef;
  SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&(this->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>,
             &local_10);
  return;
}

Assistant:

void
LabelInstr::AddLabelRef(BranchInstr *branchRef)
{
    this->labelRefs.Prepend(branchRef);
}